

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lice.cc
# Opt level: O2

vector<SensorReading,_std::allocator<SensorReading>_> * __thiscall
P8Lice::getReadings(vector<SensorReading,_std::allocator<SensorReading>_> *__return_storage_ptr__,
                   P8Lice *this,time_t start_time,time_t stop_time)

{
  bool bVar1;
  ostream *poVar2;
  mapped_type *this_00;
  JSONArray *a;
  JSONValue *pJVar3;
  longlong *plVar4;
  double *pdVar5;
  bool *pbVar6;
  JSONArray rows;
  SensorReading toadd;
  JSONObject reply;
  stringstream keys;
  int local_33c;
  JSONArray local_338;
  allocator<char> local_322;
  allocator<char> local_321;
  vector<SensorReading,_std::allocator<SensorReading>_> *local_320;
  string local_318;
  string local_2f8;
  undefined1 local_2d8 [48];
  _Alloc_hider local_2a8;
  size_type local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  longlong local_288;
  long local_280;
  bool local_278;
  _Alloc_hider local_270;
  size_type local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  double local_250;
  _Alloc_hider local_248;
  size_type local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  string local_228;
  string local_208;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
  local_1e8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  (__return_storage_ptr__->super__Vector_base<SensorReading,_std::allocator<SensorReading>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SensorReading,_std::allocator<SensorReading>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SensorReading,_std::allocator<SensorReading>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_320 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar2 = std::operator<<(local_1a8,"?startkey=");
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  poVar2 = std::operator<<(poVar2,"000&endkey=");
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::operator<<(poVar2,"000");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"_design/plotdata/_view/all",(allocator<char> *)local_2d8);
  std::__cxx11::stringbuf::str();
  CouchDBInterface::getView((JSONObject *)&local_1e8,&this->interface,&local_208,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d8,"rows",(allocator<char> *)&local_318);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
                          *)&local_1e8,(key_type *)local_2d8);
  a = JSON::JSONValue::getArrayValue(this_00);
  JSON::JSONArray::JSONArray(&local_338,a);
  std::__cxx11::string::~string((string *)local_2d8);
  if (local_338.n_elements != 0) {
    for (local_33c = 0; local_33c < local_338.n_elements; local_33c = local_33c + 1) {
      local_2d8._0_8_ = local_2d8 + 0x10;
      local_2d8._8_8_ = 0;
      local_2d8[0x10] = '\0';
      local_2a8._M_p = (pointer)&local_298;
      local_2a0 = 0;
      local_298._M_local_buf[0] = '\0';
      local_270._M_p = (pointer)&local_260;
      local_268 = 0;
      local_260._M_local_buf[0] = '\0';
      local_248._M_p = (pointer)&local_238;
      local_240 = 0;
      local_238._M_local_buf[0] = '\0';
      pJVar3 = JSON::JSONArray::operator[](&local_338,&local_33c);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"value",&local_321);
      pJVar3 = JSON::JSONValue::operator[](pJVar3,&local_318);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f8,"sensor_name",&local_322);
      pJVar3 = JSON::JSONValue::operator[](pJVar3,&local_2f8);
      JSON::JSONValue::getStringValue_abi_cxx11_(pJVar3);
      std::__cxx11::string::_M_assign((string *)local_2d8);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_318);
      pJVar3 = JSON::JSONArray::operator[](&local_338,&local_33c);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"value",&local_321);
      pJVar3 = JSON::JSONValue::operator[](pJVar3,&local_318);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f8,"timestamp_mseconds",&local_322);
      pJVar3 = JSON::JSONValue::operator[](pJVar3,&local_2f8);
      plVar4 = JSON::JSONValue::getIntValue(pJVar3);
      local_288 = *plVar4;
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_318);
      local_280 = local_288 / 1000;
      pJVar3 = JSON::JSONArray::operator[](&local_338,&local_33c);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"value",&local_321);
      pJVar3 = JSON::JSONValue::operator[](pJVar3,&local_318);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"units",&local_322);
      pJVar3 = JSON::JSONValue::operator[](pJVar3,&local_2f8);
      JSON::JSONValue::getStringValue_abi_cxx11_(pJVar3);
      std::__cxx11::string::_M_assign((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_318);
      pJVar3 = JSON::JSONArray::operator[](&local_338,&local_33c);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"value",&local_321);
      pJVar3 = JSON::JSONValue::operator[](pJVar3,&local_318);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"value",&local_322);
      pJVar3 = JSON::JSONValue::operator[](pJVar3,&local_2f8);
      pdVar5 = JSON::JSONValue::getDoubleValue(pJVar3);
      local_2d8._32_8_ = *pdVar5;
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_318);
      pJVar3 = JSON::JSONArray::operator[](&local_338,&local_33c);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"value",&local_321);
      pJVar3 = JSON::JSONValue::operator[](pJVar3,&local_318);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f8,"uncalibrated_value",&local_322);
      pJVar3 = JSON::JSONValue::operator[](pJVar3,&local_2f8);
      bVar1 = JSON::JSONValue::isNull(pJVar3);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_318);
      if (!bVar1) {
        pJVar3 = JSON::JSONArray::operator[](&local_338,&local_33c);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"value",&local_321);
        pJVar3 = JSON::JSONValue::operator[](pJVar3,&local_318);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2f8,"uncalibrated_value",&local_322);
        pJVar3 = JSON::JSONValue::operator[](pJVar3,&local_2f8);
        pdVar5 = JSON::JSONValue::getDoubleValue(pJVar3);
        local_250 = *pdVar5;
        std::__cxx11::string::~string((string *)&local_2f8);
        std::__cxx11::string::~string((string *)&local_318);
      }
      pJVar3 = JSON::JSONArray::operator[](&local_338,&local_33c);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"value",&local_321);
      pJVar3 = JSON::JSONValue::operator[](pJVar3,&local_318);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f8,"uncalibrated_units",&local_322);
      pJVar3 = JSON::JSONValue::operator[](pJVar3,&local_2f8);
      bVar1 = JSON::JSONValue::isNull(pJVar3);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_318);
      if (!bVar1) {
        pJVar3 = JSON::JSONArray::operator[](&local_338,&local_33c);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"value",&local_321);
        pJVar3 = JSON::JSONValue::operator[](pJVar3,&local_318);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2f8,"uncalibrated_units",&local_322);
        pJVar3 = JSON::JSONValue::operator[](pJVar3,&local_2f8);
        JSON::JSONValue::getStringValue_abi_cxx11_(pJVar3);
        std::__cxx11::string::_M_assign((string *)&local_248);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::__cxx11::string::~string((string *)&local_318);
      }
      pJVar3 = JSON::JSONArray::operator[](&local_338,&local_33c);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"value",&local_321);
      pJVar3 = JSON::JSONValue::operator[](pJVar3,&local_318);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f8,"precision",&local_322);
      pJVar3 = JSON::JSONValue::operator[](pJVar3,&local_2f8);
      bVar1 = JSON::JSONValue::isNull(pJVar3);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_318);
      if (!bVar1) {
        pJVar3 = JSON::JSONArray::operator[](&local_338,&local_33c);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"value",&local_321);
        pJVar3 = JSON::JSONValue::operator[](pJVar3,&local_318);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2f8,"precision",&local_322);
        pJVar3 = JSON::JSONValue::operator[](pJVar3,&local_2f8);
        plVar4 = JSON::JSONValue::getIntValue(pJVar3);
        local_2d8._40_4_ = (undefined4)*plVar4;
        std::__cxx11::string::~string((string *)&local_2f8);
        std::__cxx11::string::~string((string *)&local_318);
      }
      pJVar3 = JSON::JSONArray::operator[](&local_338,&local_33c);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"value",&local_321);
      pJVar3 = JSON::JSONValue::operator[](pJVar3,&local_318);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f8,"has_error",&local_322);
      pJVar3 = JSON::JSONValue::operator[](pJVar3,&local_2f8);
      bVar1 = JSON::JSONValue::isNull(pJVar3);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_318);
      if (bVar1) {
        local_278 = false;
      }
      else {
        pJVar3 = JSON::JSONArray::operator[](&local_338,&local_33c);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"value",&local_321);
        pJVar3 = JSON::JSONValue::operator[](pJVar3,&local_318);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2f8,"has_error",&local_322);
        pJVar3 = JSON::JSONValue::operator[](pJVar3,&local_2f8);
        pbVar6 = JSON::JSONValue::getBoolValue(pJVar3);
        local_278 = *pbVar6;
        std::__cxx11::string::~string((string *)&local_2f8);
        std::__cxx11::string::~string((string *)&local_318);
        if ((local_278 & 1U) != 0) {
          pJVar3 = JSON::JSONArray::operator[](&local_338,&local_33c);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_318,"value",&local_321);
          pJVar3 = JSON::JSONValue::operator[](pJVar3,&local_318);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2f8,"error_value",&local_322);
          pJVar3 = JSON::JSONValue::operator[](pJVar3,&local_2f8);
          JSON::JSONValue::getStringValue_abi_cxx11_(pJVar3);
          std::__cxx11::string::_M_assign((string *)&local_270);
          std::__cxx11::string::~string((string *)&local_2f8);
          std::__cxx11::string::~string((string *)&local_318);
        }
      }
      std::vector<SensorReading,_std::allocator<SensorReading>_>::push_back
                (local_320,(value_type *)local_2d8);
      SensorReading::~SensorReading((SensorReading *)local_2d8);
    }
  }
  JSON::JSONArray::~JSONArray(&local_338);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
  ::~_Rb_tree(&local_1e8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return local_320;
}

Assistant:

vector<SensorReading> P8Lice::getReadings(time_t start_time, time_t stop_time) {
	vector<SensorReading> ret;
	stringstream keys;
	keys << "?startkey=" << start_time << "000&endkey=" << stop_time << "000";
	JSONObject reply=interface.getView("_design/plotdata/_view/all",keys.str());
	JSONArray rows=reply["rows"].getArrayValue();
	if(rows.length()==0)
		return ret;
	for(int i=0;i<rows.length();i++) {
		SensorReading toadd;
		toadd.sensor_name=rows[i]["value"]["sensor_name"].getStringValue();
		toadd.timestamp_ms=rows[i]["value"]["timestamp_mseconds"].getIntValue();
		toadd.timestamp=(toadd.timestamp_ms)/1000;
		toadd.units=rows[i]["value"]["units"].getStringValue();
		toadd.value=rows[i]["value"]["value"].getDoubleValue();
		if(!rows[i]["value"]["uncalibrated_value"].isNull())
			toadd.uncalibrated_value=rows[i]["value"]["uncalibrated_value"].getDoubleValue();
		if(!rows[i]["value"]["uncalibrated_units"].isNull())
			toadd.uncalibrated_units=rows[i]["value"]["uncalibrated_units"].getStringValue();
		if(!rows[i]["value"]["precision"].isNull())
			toadd.precision=rows[i]["value"]["precision"].getIntValue();
		if(!rows[i]["value"]["has_error"].isNull())
			toadd.has_error=rows[i]["value"]["has_error"].getBoolValue();
		else
			toadd.has_error=false;
		if(toadd.has_error)
			toadd.error_value=rows[i]["value"]["error_value"].getStringValue();
		ret.push_back(toadd);
	}
	return ret;
}